

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.h
# Opt level: O0

void __thiscall
jaegertracing::Tag::Tag<std::__cxx11::string_const&>
          (Tag *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *key_local;
  Tag *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  opentracing::v3::Value::Value(&this->_value,value);
  return;
}

Assistant:

Tag(const std::string& key, ValueArg&& value)
        : _key(key)
        , _value(std::forward<ValueArg>(value))
    {
    }